

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error store_cache<24>(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  unsigned_long uVar2;
  undefined8 in_RCX;
  optional<unsigned_long> oVar3;
  int local_74;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> cache;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  cache.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,".");
  oVar3 = find_in_table((token *)op,store_cache<24>::table,local_48);
  local_38._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  cache.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar1) {
    context::tokenize(&local_70,(context *)token);
    memcpy(op,&local_70,0x24);
  }
  local_74 = 0;
  uVar2 = std::optional<unsigned_long>::value_or<int>
                    ((optional<unsigned_long> *)&local_38,&local_74);
  opcode::add_bits((opcode *)
                   cache.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_8_,uVar2 << 0x18);
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(store_cache)
{
    static const char* table[] = {"", "CG", "CS", "WT", nullptr};
    std::optional<uint64_t> cache = find_in_table(token, table, ".");
    if (cache) {
        token = ctx.tokenize();
    }
    op.add_bits(cache.value_or(0) << address);
    return {};
}